

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O0

void create_secret_door(level *lev,mkroom *croom,xchar walls)

{
  undefined1 uVar1;
  int iVar2;
  int local_20;
  char local_1b;
  char local_1a;
  int count;
  xchar sy;
  xchar sx;
  xchar walls_local;
  mkroom *croom_local;
  level *lev_local;
  
  local_20 = 0;
  do {
    if (99 < local_20) {
      impossible("couldn\'t create secret door on any walls 0x%x",(ulong)(uint)(int)walls);
      return;
    }
    iVar2 = rn2(((int)croom->hx - (int)croom->lx) + 1);
    uVar1 = croom->lx;
    local_1a = (char)iVar2 + uVar1;
    iVar2 = rn2(((int)croom->hy - (int)croom->ly) + 1);
    local_1b = (char)iVar2 + croom->ly;
    iVar2 = rn2(4);
    switch(iVar2) {
    case 0:
      if ((walls & 1U) != 0) {
        local_1b = croom->ly + -1;
        break;
      }
      goto LAB_002e056f;
    case 1:
      if ((walls & 2U) == 0) goto LAB_002e056f;
      local_1b = croom->hy + '\x01';
      break;
    case 2:
      if ((walls & 4U) == 0) goto LAB_002e056f;
      local_1a = croom->lx + -1;
      break;
    case 3:
      if ((walls & 8U) == 0) goto LAB_002e056f;
      local_1a = croom->hx + '\x01';
    }
    iVar2 = okdoor(lev,local_1a,local_1b);
    if (iVar2 != 0) {
      lev->locations[local_1a][local_1b].typ = '\x0f';
      *(uint *)&lev->locations[local_1a][local_1b].field_0x6 =
           *(uint *)&lev->locations[local_1a][local_1b].field_0x6 & 0xfffffe0f | 0x40;
      add_door(lev,(int)local_1a,(int)local_1b,croom);
      return;
    }
LAB_002e056f:
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

void create_secret_door(struct level *lev,
			struct mkroom *croom,
			xchar walls) /* any of W_NORTH | W_SOUTH | W_EAST | W_WEST
					(or W_ANY) */
{
    xchar sx, sy; /* location of the secret door */
    int count;

    for (count = 0; count < 100; count++) {
	sx = rn1(croom->hx - croom->lx + 1, croom->lx);
	sy = rn1(croom->hy - croom->ly + 1, croom->ly);

	switch(rn2(4)) {
	case 0:  /* top */
	    if (!(walls & W_NORTH)) continue;
	    sy = croom->ly-1; break;
	case 1: /* bottom */
	    if (!(walls & W_SOUTH)) continue;
	    sy = croom->hy+1; break;
	case 2: /* left */
	    if (!(walls & W_EAST)) continue;
	    sx = croom->lx-1; break;
	case 3: /* right */
	    if (!(walls & W_WEST)) continue;
	    sx = croom->hx+1; break;
	}

	if (okdoor(lev, sx, sy)) {
	    lev->locations[sx][sy].typ = SDOOR;
	    lev->locations[sx][sy].doormask = D_CLOSED;
	    add_door(lev, sx, sy, croom);
	    return;
	}
    }

    impossible("couldn't create secret door on any walls 0x%x", walls);
}